

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

void __thiscall libDAI::NDP::EliminateVariable(NDP *this,size_t i_th_var)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  undefined4 extraout_var;
  Var *n;
  const_reference __x;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  Factor *pFVar9;
  reference pvVar10;
  reference pvVar11;
  undefined4 extraout_var_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __position;
  undefined8 *puVar12;
  size_t sVar13;
  size_t i_2;
  nb_type *n_00;
  nb_type *n_01;
  size_t sVar14;
  size_t i;
  ulong uVar15;
  size_type sVar16;
  size_t sVar17;
  size_t i_1;
  size_type sVar18;
  size_t j;
  ulong __n;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  nb_type neighVIs2;
  VarSet neighVs;
  VarSet vs_F;
  TProb<double> local_250;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> vs_vec;
  vector<libDAI::Index,_std::allocator<libDAI::Index>_> index_vec;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  undefined1 local_1f0 [56];
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighVIs2_1;
  TProb<double> local_198 [15];
  
  if ((this->Props).verbose != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Starting elimination of ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"-th var...");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->_m_varOrder,i_th_var);
  sVar18 = *pvVar5;
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                       ((long *)CONCAT44(extraout_var,iVar3),sVar18);
  __x = std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::at(&this->_m_neighV,sVar18);
  puVar1 = (__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Props).verbose != 0) {
    neighVIs2_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    neighVIs2_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    neighVIs2_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&neighVIs2_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  neighVIs2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  neighVIs2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  neighVIs2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GetVNeighsV(&neighVIs2_1,this,sVar18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&neighVIs2,
             &neighVIs2_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&neighVIs2_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  VarSetFromNB(&neighVs,this,&neighVIs2);
  sVar18 = (long)puVar1 - (long)puVar2 >> 3;
  uVar15 = (long)neighVs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)neighVs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                 .super__Vector_impl_data._M_start >> 4;
  if (1 < (this->Props).verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"it praticipates in ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," factors");
    if (2 < (this->Props).verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,": ");
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0,__x);
      printNB_abi_cxx11_((string *)&neighVIs2_1,(NDP *)local_1f0,n_00);
      std::operator<<(poVar4,(string *)&neighVIs2_1);
      std::__cxx11::string::~string((string *)&neighVIs2_1);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<((ostream *)&std::cout,"it has ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," variables neighbors");
    if (2 < (this->Props).verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,": ");
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,&neighVIs2);
      printNB_abi_cxx11_((string *)&neighVIs2_1,(NDP *)&local_208,n_01);
      std::operator<<(poVar4,(string *)&neighVIs2_1);
      std::__cxx11::string::~string((string *)&neighVIs2_1);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_208);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if ((this->_m_induced_width < uVar15) &&
     (this->_m_induced_width = uVar15, (this->Props).verbose != 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Induced width increased to ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  TFactor<double>::TFactor((TFactor<double> *)&neighVIs2_1,&neighVs);
  pvVar6 = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                     (&this->_m_newFacs,i_th_var);
  TFactor<double>::operator=(pvVar6,(TFactor<double> *)&neighVIs2_1);
  TFactor<double>::~TFactor((TFactor<double> *)&neighVIs2_1);
  pvVar6 = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                     (&this->_m_newFacs,i_th_var);
  SetNeighF(this,i_th_var,&neighVs);
  this_00 = &this->_m_bestResps;
  pvVar7 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::at(this_00,i_th_var);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (pvVar7,(long)(pvVar6->_p)._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar6->_p)._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::vector
            (&index_vec,sVar18,(allocator_type *)&neighVIs2_1);
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::vector
            (&vs_vec,sVar18,(allocator_type *)&neighVIs2_1);
  for (sVar16 = 0; sVar18 != sVar16; sVar16 = sVar16 + 1) {
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(__x,sVar16);
    pFVar9 = GetFactor(this,*pvVar8);
    VarSet::VarSet(&vs_F,&pFVar9->_vs);
    VarSet::operator/=(&vs_F,n);
    pvVar10 = std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::at(&vs_vec,sVar16);
    VarSet::operator=(pvVar10,&vs_F);
    Index::Index((Index *)&neighVIs2_1,&vs_F,&neighVs);
    pvVar11 = std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::at(&index_vec,sVar16);
    Index::operator=(pvVar11,(Index *)&neighVIs2_1);
    Index::~Index((Index *)&neighVIs2_1);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&vs_F);
  }
  uVar15 = 0;
  while( true ) {
    if (neighVs._statespace <= uVar15) {
      if (6 < (this->Props).verbose) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "New factor (and best-responses) computed, updating neighbors...");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      for (uVar15 = 0;
          uVar15 < (ulong)((long)neighVIs2.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)neighVIs2.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1
          ) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&neighVIs2,uVar15);
        pvVar7 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::at(&this->_m_neighV,*pvVar5);
        iVar3 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[9])();
        neighVIs2_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(CONCAT44(extraout_var_00,iVar3) + i_th_var);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pvVar7,(value_type_conflict2 *)&neighVIs2_1);
        for (__n = 0; __n < (ulong)((long)(__x->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(__x->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 3);
            __n = __n + 1) {
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(__x,__n);
          vs_F._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*pvVar8;
          __position = std::
                       __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                 ((pvVar7->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pvVar7->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish,&vs_F);
          if (__position._M_current !=
              (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                      (pvVar7,(const_iterator)__position._M_current);
          }
        }
      }
      if (1 < (this->Props).verbose) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar4 = std::operator<<(poVar4,"-th variable (varIndex=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,") has been eliminated");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&vs_vec);
      std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::~vector(&index_vec);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&neighVs);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&neighVIs2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    VarSet::VarSet((VarSet *)&neighVIs2_1,n);
    TFactor<double>::TFactor((TFactor<double> *)&vs_F,(VarSet *)&neighVIs2_1,0.0);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&neighVIs2_1);
    for (sVar16 = 0; sVar18 != sVar16; sVar16 = sVar16 + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(__x,sVar16);
      pFVar9 = GetFactor(this,*pvVar8);
      pvVar10 = std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::at(&vs_vec,sVar16);
      pvVar11 = std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::at(&index_vec,sVar16);
      TFactor<double>::slice((Factor *)&neighVIs2_1,pFVar9,pvVar10,pvVar11->_index);
      TProb<double>::operator+=(&local_250,local_198);
      Index::operator++(pvVar11);
      TFactor<double>::~TFactor((Factor *)&neighVIs2_1);
    }
    sVar13 = (long)local_250._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_250._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (sVar13 != n->_states) break;
    auVar20 = ZEXT816(0xffefffffffffffff);
    sVar17 = 0;
    for (sVar14 = 0; dVar19 = auVar20._0_8_, sVar13 != sVar14; sVar14 = sVar14 + 1) {
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           local_250._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[sVar14];
      auVar20 = vmaxsd_avx(auVar21,auVar20);
      if (dVar19 < local_250._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar14]) {
        sVar17 = sVar14;
      }
    }
    (pvVar6->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15] = dVar19;
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::at(this_00,i_th_var);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(pvVar7,uVar15);
    *pvVar5 = sVar17;
    if (3 < (this->Props).verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"best-response for ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"-th \'local state\' is ");
      pvVar7 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::at(this_00,i_th_var);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(pvVar7,uVar15);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," (value = ");
      poVar4 = std::ostream::_M_insert<double>
                         ((pvVar6->_p)._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar15]);
      poVar4 = std::operator<<(poVar4,")");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    TFactor<double>::~TFactor((TFactor<double> *)&vs_F);
    uVar15 = uVar15 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&neighVIs2_1);
  poVar4 = std::operator<<((ostream *)
                           &neighVIs2_1.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           "contribution_vec_v.stateSpace() = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," != v.states() = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  puVar12 = (undefined8 *)__cxa_allocate_exception(8);
  std::__cxx11::stringbuf::str();
  *puVar12 = local_1f0._24_8_;
  __cxa_throw(puVar12,&char_const*::typeinfo,0);
}

Assistant:

void NDP::EliminateVariable(size_t i_th_var)
    {
        if(Props.verbose >= 1)
            cout << "Starting elimination of "<<i_th_var<<"-th var..."<<endl;

        size_t varIndex = _m_varOrder.at(i_th_var);
        const FactorGraph& g = grm();

        //this has been replaced by the GetFactor function that 
        //generalizes to refer to *all* (orig+ new) factors
        //const std::vector < Factor > & 	facs = g.factors();

        //get ref the the variable 
        const Var & v = g.var(varIndex);

        //get all the factors of the var - use the local 'GetNeighsV' function!
        //(since that include newly constructed factors, and only factors
        //that are still in consideration)
        const FactorGraph::nb_type &  neighFIs = GetNeighsV(varIndex);
        size_t num_Fs = neighFIs.size();
            if(Props.verbose >= 1)

        vector<size_t> neighVIs2;

        //get all the (indices of) neighbors of those, the 'neighVIs2' 
        //!??!? I used 'neighVIs' but that gave compiler errors?!?
        nb_type neighVIs2;
        //cout << printNB(neighVIs2);
        neighVIs2 = GetVNeighsV(varIndex);
        //get all the neighbors of those, the 'neighVs' 
        VarSet neighVs = VarSetFromNB(neighVIs2);
        size_t num_Vs = neighVs.size();
        if(Props.verbose >= 2)
        {
            cout << "it praticipates in "<<num_Fs << " factors";
            if(Props.verbose >= 3)
                cout << ": "<< printNB(neighFIs);
            cout <<endl;
            cout << "it has "<<num_Vs << " variables neighbors";
            if(Props.verbose >= 3)
                cout << ": "<< printNB(neighVIs2);
            cout <<endl;
        }
        if(num_Vs > _m_induced_width)
        {
            _m_induced_width = num_Vs;
            if(Props.verbose >= 1)
                cout << "Induced width increased to "<<_m_induced_width<<endl;
        }

        //the new factor will include all these neighVs:
        _m_newFacs.at(i_th_var) = Factor(neighVs);
        Factor& newFactor = _m_newFacs.at(i_th_var);
        SetNeighF(i_th_var, neighVs);

        //and we will need to keep track of the best-responses
        //of this variable v
        _m_bestResps.at(i_th_var).resize( newFactor.stateSpace() );

        //loop over all states of neighVs, compute v's best response
        //and store as a new factor.
        
        //make an index(vs_F, neighVs) for each factor F in neighFs
        vector< Index > index_vec(num_Fs);
        vector< VarSet > vs_vec(num_Fs);
        for(size_t i=0; i < num_Fs; i++)
        {
            size_t fI = neighFIs.at(i);
            const Factor& F = GetFactor( fI );
            VarSet vs_F = F.vars();
            //remove variable varIndex:
            vs_F /= v;
            vs_vec.at(i) = vs_F;
            index_vec.at(i) = Index(vs_F, neighVs);
        }
        for( size_t jI=0; jI < neighVs.stateSpace(); jI++)
        {//compute best response against joint state jI.
            //here we will store the amount that v can achieve by
            //selecting each of its states when neighVs have state jI:
            Factor contribution_vec_v(v, 0.0);

            //loop over all neighFs
            //-get the slice that corresponds to the assignment of 'states'
            // according to jI (this should be a vector of v's states)
            //-add to contribution_vec_v 
            for(size_t i=0; i < num_Fs; i++)
            {
                //process the i-th neighboring factor, corresponding to 
                size_t fI = neighFIs.at(i);
                const Factor& f = GetFactor( fI );
                VarSet & vs_i = vs_vec.at(i);
                Index & index_i = index_vec.at(i);
                Factor sliced_Fi = f.slice( vs_i, index_i);
                //sliced_Fi should be a factor depending only on v now...
                //and thus we add it to the contribution_vec_v
                contribution_vec_v += sliced_Fi;
                
                //update its index:
                ++index_i;
            }

            //sanity check:
            if( contribution_vec_v.stateSpace() != v.states() )
            {
                stringstream ss;
                ss << "contribution_vec_v.stateSpace() = "<<
                   contribution_vec_v.stateSpace() <<
                   " != v.states() = "<< 
                   v.states() << endl;

                throw ( ss.str().c_str() );
            }

            //now the state of v that has the highest value in 
            //contribution_vec_v is the best response:
            double val = -DBL_MAX;
            size_t brI = 0;
            for(size_t i=0; i < v.states() ; i++)
                if( contribution_vec_v[i] > val)
                {
                    val = contribution_vec_v[i];
                    brI = i;
                }
            
            newFactor[jI] = val;
            _m_bestResps.at(i_th_var).at(jI) = brI;

            if(Props.verbose >= 4)
                cout << "best-response for "<<jI<<"-th 'local state' is "<<
                    _m_bestResps.at(i_th_var).at(jI) << " (value = "<<
                    newFactor[jI] <<")"<<endl;

        }
        if(Props.verbose >= 7)
            cout << "New factor (and best-responses) computed, updating neighbors..."<<
               endl; 

        //update: _m_neighV
        //-> the factors with indices 'neighFIs' have been removed
        //-> these factors have been replaced by 
        //      'newFactor = _m_newFacs.at(i_th_var)'
        //   whose global index is given by 
        //      gI = ToGlobalFactorIndex(i_th_var)
        //
        //-> the variables in Varset  'neighVs'  are affected by that
        //      - remove old factor indices
        //      - add gI
        
        for(size_t i=0; i < neighVIs2.size(); i++)
        {
            size_t vI = neighVIs2.at(i);
            nb_type & nb_vI = _m_neighV.at(vI);
            
            //add new factor to nb_vI
            size_t gI = ToGlobalFactorIndex(i_th_var);
            nb_vI.push_back(gI);

            //remove indices from neighFIs
            for(size_t j=0; j<neighFIs.size(); j++)
            {
                size_t fI = neighFIs.at(j);
                //check if fI in nb_vI
                //     std::find(vector.begin(), vector.end(), item)!=vector.end()
                nb_type::iterator pos = std::find(
                        nb_vI.begin(),
                        nb_vI.end(),
                        fI);
                //i guess it will do not harm if pos==end() ?
                //nb_vI.erase(pos);
                //well the segfault indicates otherwise:
                if(pos != nb_vI.end())
                    nb_vI.erase(pos);
            }
        }

        //update _m_neighF
        //-> remove this agent from any neighborhood
        //-> but is not necessary... all its factors have been removed!

        if(Props.verbose >= 2)
            cout << i_th_var<<"-th variable (varIndex="<<varIndex<<
                ") has been eliminated"<<endl;

    }